

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O3

void __thiscall
TEST_MockComparatorCopierTest_unexpectedCustomTypeOutputParameter_Test::testBody
          (TEST_MockComparatorCopierTest_unexpectedCustomTypeOutputParameter_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  UtestShell *test;
  undefined4 extraout_var;
  MockFailureReporterInstaller failureReporterInstaller;
  MyTypeForTesting actualObject;
  MockExpectedCallsListForTest expectations;
  MyTypeForTestingCopier copier;
  MockUnexpectedOutputParameterFailure expectedFailure;
  MockNamedValue parameter;
  MockFailureReporterInstaller local_131;
  SimpleString local_130;
  SimpleString local_120;
  undefined **local_110;
  undefined8 *local_108;
  MockExpectedCallsList local_100;
  SimpleString local_f0;
  SimpleString local_e0;
  undefined **local_d0;
  TestFailure local_c8;
  MockNamedValue local_60;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&local_131);
  local_110 = &PTR__MyTypeForTesting_002b2490;
  local_108 = (undefined8 *)
              operator_new(8,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                           ,0x2e);
  *local_108 = 0x2282;
  local_d0 = &PTR__MockNamedValueCopier_002b2ca8;
  SimpleString::SimpleString((SimpleString *)&local_c8,"");
  pMVar2 = mock((SimpleString *)&local_c8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString((SimpleString *)&local_60,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2d])(pMVar2,&local_60,&local_d0);
  SimpleString::~SimpleString((SimpleString *)&local_60);
  SimpleString::~SimpleString((SimpleString *)&local_c8);
  MockExpectedCallsList::MockExpectedCallsList(&local_100);
  local_100._vptr_MockExpectedCallsList = (_func_int **)&PTR__MockExpectedCallsListForTest_002aa030;
  SimpleString::SimpleString((SimpleString *)&local_c8,"foo");
  MockExpectedCallsListForTest::addFunction
            ((MockExpectedCallsListForTest *)&local_100,(SimpleString *)&local_c8);
  SimpleString::~SimpleString((SimpleString *)&local_c8);
  SimpleString::SimpleString((SimpleString *)&local_c8,"parameterName");
  MockNamedValue::MockNamedValue(&local_60,(SimpleString *)&local_c8);
  SimpleString::~SimpleString((SimpleString *)&local_c8);
  SimpleString::SimpleString((SimpleString *)&local_c8,"MyTypeForTesting");
  MockNamedValue::setConstObjectPointer(&local_60,(SimpleString *)&local_c8,&local_110);
  SimpleString::~SimpleString((SimpleString *)&local_c8);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_130,"foo");
  MockUnexpectedOutputParameterFailure::MockUnexpectedOutputParameterFailure
            ((MockUnexpectedOutputParameterFailure *)&local_c8,test,&local_130,&local_60,&local_100)
  ;
  SimpleString::~SimpleString(&local_130);
  SimpleString::SimpleString(&local_130,"");
  pMVar2 = mock(&local_130,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_120,"foo");
  (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_120);
  SimpleString::~SimpleString(&local_120);
  SimpleString::~SimpleString(&local_130);
  SimpleString::SimpleString(&local_130,"");
  pMVar2 = mock(&local_130,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_120,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_120);
  SimpleString::SimpleString(&local_e0,"MyTypeForTesting");
  SimpleString::SimpleString(&local_f0,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x30))
            ((long *)CONCAT44(extraout_var,iVar1),&local_e0,&local_f0,&local_110);
  SimpleString::~SimpleString(&local_f0);
  SimpleString::~SimpleString(&local_e0);
  SimpleString::~SimpleString(&local_120);
  SimpleString::~SimpleString(&local_130);
  SimpleString::SimpleString(&local_130,"");
  pMVar2 = mock(&local_130,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&local_130);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)&local_c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
             ,0xd9);
  SimpleString::SimpleString(&local_130,"");
  pMVar2 = mock(&local_130,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x2f])(pMVar2);
  SimpleString::~SimpleString(&local_130);
  TestFailure::~TestFailure(&local_c8);
  MockNamedValue::~MockNamedValue(&local_60);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)&local_100);
  local_110 = &PTR__MyTypeForTesting_002b2490;
  operator_delete(local_108,8);
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&local_131);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, unexpectedCustomTypeOutputParameter)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MyTypeForTesting actualObject(8834);
    MyTypeForTestingCopier copier;
    mock().installCopier("MyTypeForTesting", copier);

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo");
    MockNamedValue parameter("parameterName");
    parameter.setConstObjectPointer("MyTypeForTesting", &actualObject);
    MockUnexpectedOutputParameterFailure expectedFailure(mockFailureTest(), "foo", parameter, expectations);

    mock().expectOneCall("foo");
    mock().actualCall("foo").withOutputParameterOfType("MyTypeForTesting", "parameterName", &actualObject);
    mock().checkExpectations();

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);

    mock().removeAllComparatorsAndCopiers();
}